

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.h
# Opt level: O0

string * __thiscall Symbol::to_string_abi_cxx11_(string *__return_storage_ptr__,Symbol *this)

{
  ostream *poVar1;
  int type;
  string local_1c0;
  stringstream local_1a0 [8];
  stringstream osf;
  ostream local_190 [376];
  Symbol *local_18;
  Symbol *this_local;
  
  local_18 = this;
  this_local = (Symbol *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Token::get_typename_abi_cxx11_(&local_1c0,(Token *)(ulong)(uint)this->type,type);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\t\t");
  poVar1 = std::operator<<(poVar1,(string *)&this->name);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string to_string() const {
        stringstream osf;
        osf << Token::get_typename(type) << "\t\t" << name << endl;
        return osf.str();
    }